

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferOperations::deinitSecondPhase(TextureBufferOperations *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureBufferOperations *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  if (this->m_vertex_location != -1) {
    (**(code **)(lVar3 + 0x518))(this->m_vertex_location);
    this->m_vertex_location = -1;
  }
  if (this->m_index_location != -1) {
    (**(code **)(lVar3 + 0x518))(this->m_index_location);
    this->m_index_location = -1;
  }
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_po_vs_fs_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po_vs_fs_id);
    this->m_po_vs_fs_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vbo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo_id);
    this->m_vbo_id = 0;
  }
  if (this->m_vbo_indicies_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo_indicies_id);
    this->m_vbo_indicies_id = 0;
  }
  return;
}

Assistant:

void TextureBufferOperations::deinitSecondPhase(void)
{
	/* Get GLES entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindVertexArray(0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	if (m_vertex_location != -1)
	{
		gl.disableVertexAttribArray(m_vertex_location);
		m_vertex_location = -1;
	}

	if (m_index_location != -1)
	{
		gl.disableVertexAttribArray(m_index_location);
		m_index_location = -1;
	}

	gl.useProgram(0);

	/* Delete GLES objects */
	if (0 != m_po_vs_fs_id)
	{
		gl.deleteProgram(m_po_vs_fs_id);
		m_po_vs_fs_id = 0;
	}

	if (0 != m_fs_id)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (0 != m_vs_id)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (0 != m_fbo_id)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}

	if (0 != m_to_id)
	{
		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
	}

	if (0 != m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	if (0 != m_vbo_id)
	{
		gl.deleteBuffers(1, &m_vbo_id);
		m_vbo_id = 0;
	}

	if (0 != m_vbo_indicies_id)
	{
		gl.deleteBuffers(1, &m_vbo_indicies_id);
		m_vbo_indicies_id = 0;
	}
}